

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Generators::Generators<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>::populate
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_long_double>_> *this,
          unary_op_tuple<trng::portable_impl::uint128,_long_double> *val)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  pointer *__ptr;
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_long_double>_> local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
        )operator_new(0x30);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_0031b0b8;
  uVar1 = (val->a).m_hi;
  lVar2 = *(long *)&val->y;
  lVar3 = *(long *)((long)&val->y + 8);
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
          ._M_head_impl + 0x10) = (val->a).m_lo;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
          ._M_head_impl + 0x18) = uVar1;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar2;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                  ._M_head_impl + 0x28) = lVar3;
  std::
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,long_double>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,long_double>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,long_double>>>
            ((vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,long_double>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,long_double>>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }